

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

Duration * __thiscall absl::lts_20250127::Duration::operator%=(Duration *this,Duration rhs)

{
  Duration num;
  bool bVar1;
  int64_t local_30;
  
  num = *this;
  bVar1 = anon_unknown_1::IDivFastPath(*this,rhs,&local_30,this);
  if (!bVar1) {
    anon_unknown_1::IDivSlowPath(false,num,rhs,this);
  }
  return this;
}

Assistant:

Duration& Duration::operator%=(Duration rhs) {
  IDivDurationImpl(false, *this, rhs, this);
  return *this;
}